

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int CreateLineEffectFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  VMFunctionBuilder::EmitParamInt(buildit,value1);
  VMFunctionBuilder::EmitParamInt(buildit,value2);
  return 2;
}

Assistant:

static int CreateLineEffectFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_LineEffect
	// This is the second MBF codepointer that couldn't be translated easily.
	// Calling P_TranslateLineDef() here was a simple matter, as was adding an
	// extra parameter to A_CallSpecial so as to replicate the LINEDONE stuff,
	// but unfortunately DEHACKED lumps are processed before the map translation
	// arrays are initialized so this didn't work.
	buildit.EmitParamInt(value1);					// special
	buildit.EmitParamInt(value2);					// tag
	return 2;
}